

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O1

Handle * __thiscall
leveldb::anon_unknown_0::ShardedLRUCache::Insert
          (ShardedLRUCache *this,Slice *key,void *value,size_t charge,
          _func_void_Slice_ptr_void_ptr *deleter)

{
  char *pcVar1;
  int *piVar2;
  size_t __n;
  LRUHandle *pLVar3;
  LRUHandle *pLVar4;
  uint32_t hash;
  uint uVar5;
  LRUHandle *pLVar6;
  size_t *psVar7;
  LRUHandle **ppLVar8;
  LRUHandle *pLVar9;
  LRUHandle *old;
  char *__dest;
  char *this_00;
  LRUCache *this_01;
  ulong uVar10;
  HandleTable *this_02;
  Slice local_40;
  
  hash = Hash(key->data_,key->size_,0);
  uVar10 = (ulong)((hash >> 0x1c) * 0x90);
  this_00 = this->shard_[0].lru_.key_data + (uVar10 - 0x70);
  port::Mutex::Lock((Mutex *)this_00);
  __n = key->size_;
  pLVar6 = (LRUHandle *)malloc(__n + 0x47);
  pLVar6->value = value;
  pLVar6->deleter = deleter;
  pLVar6->charge = charge;
  pLVar6->key_length = __n;
  pLVar6->hash = hash;
  pLVar6->refs = 2;
  __dest = pLVar6->key_data;
  memcpy(__dest,key->data_,__n);
  pLVar9 = (LRUHandle *)(this->shard_[0].lru_.key_data + (uVar10 - 0x40));
  pLVar6->next = pLVar9;
  pLVar3 = *(LRUHandle **)(this->shard_[0].lru_.key_data + (uVar10 - 0x20));
  pLVar6->prev = pLVar3;
  pLVar3->next = pLVar6;
  pLVar3 = pLVar6->next;
  pLVar3->prev = pLVar6;
  pcVar1 = this->shard_[0].lru_.key_data + (uVar10 - 0x48);
  *(size_t *)pcVar1 = *(long *)pcVar1 + charge;
  this_02 = (HandleTable *)((long)(&this->shard_[0].lru_ + 1) + 0x40 + (uVar10 - 0x40));
  if (pLVar3 == pLVar6) {
    __dest = *value;
    psVar7 = (size_t *)((long)value + 8);
  }
  else {
    psVar7 = &pLVar6->key_length;
  }
  this_01 = (LRUCache *)(this->shard_[0].lru_.key_data + (uVar10 - 0x78));
  local_40.size_ = *psVar7;
  local_40.data_ = __dest;
  ppLVar8 = HandleTable::FindPointer(this_02,&local_40,hash);
  pLVar3 = *ppLVar8;
  if (pLVar3 == (LRUHandle *)0x0) {
    pLVar6->next_hash = (LRUHandle *)0x0;
    *ppLVar8 = pLVar6;
    uVar5 = *(int *)((long)(&this->shard_[0].lru_ + 1) + 0x40 + (uVar10 - 0x3c)) + 1;
    *(uint *)((long)(&this->shard_[0].lru_ + 1) + 0x40 + (uVar10 - 0x3c)) = uVar5;
    if (*(uint *)((long)(&this->shard_[0].lru_ + 1) + 0x40 + (uVar10 - 0x40)) < uVar5) {
      HandleTable::Resize(this_02);
    }
  }
  else {
    pLVar6->next_hash = pLVar3->next_hash;
    *ppLVar8 = pLVar6;
  }
  if (pLVar3 != (LRUHandle *)0x0) {
    pLVar4 = pLVar3->next;
    pLVar4->prev = pLVar3->prev;
    pLVar3->prev->next = pLVar4;
    LRUCache::Unref(this_01,pLVar3);
  }
  while ((this_01->capacity_ < *(ulong *)(this->shard_[0].lru_.key_data + (uVar10 - 0x48)) &&
         (pLVar3 = *(LRUHandle **)(this->shard_[0].lru_.key_data + (uVar10 - 0x28)),
         pLVar3 != pLVar9))) {
    pLVar4 = pLVar3->next;
    pLVar4->prev = pLVar3->prev;
    pLVar3->prev->next = pLVar4;
    if (pLVar3->next == pLVar3) {
      local_40.data_ = *pLVar3->value;
      psVar7 = (size_t *)((long)pLVar3->value + 8);
    }
    else {
      local_40.data_ = pLVar3->key_data;
      psVar7 = &pLVar3->key_length;
    }
    local_40.size_ = *psVar7;
    ppLVar8 = HandleTable::FindPointer(this_02,&local_40,pLVar3->hash);
    if (*ppLVar8 != (LRUHandle *)0x0) {
      *ppLVar8 = (*ppLVar8)->next_hash;
      piVar2 = (int *)((long)(&this->shard_[0].lru_ + 1) + 0x40 + (uVar10 - 0x3c));
      *piVar2 = *piVar2 + -1;
    }
    LRUCache::Unref(this_01,pLVar3);
  }
  port::Mutex::Unlock((Mutex *)this_00);
  return (Handle *)pLVar6;
}

Assistant:

virtual Handle *Insert(const Slice &key, void *value, size_t charge,
                                   void (*deleter)(const Slice &key, void *value)) {
                const uint32_t hash = HashSlice(key);
                return shard_[Shard(hash)].Insert(key, hash, value, charge, deleter);
            }